

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

timediff_t Curl_conn_shutdown_timeleft(connectdata *conn,curltime *nowp)

{
  byte bVar1;
  timediff_t tVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  curltime cVar6;
  curltime local_40;
  
  if ((conn->shutdown).timeout_ms == 0) {
    lVar4 = 0;
  }
  else {
    bVar1 = 1;
    lVar3 = 0;
    lVar4 = 0;
    do {
      if ((conn->shutdown).start[lVar3].tv_sec != 0) {
        if (nowp == (curltime *)0x0) {
          cVar6 = Curl_now();
          local_40.tv_sec = cVar6.tv_sec;
          local_40.tv_usec = cVar6.tv_usec;
          nowp = &local_40;
        }
        tVar2 = Curl_shutdown_timeleft(conn,(int)lVar3,nowp);
        if (tVar2 != 0) {
          lVar3 = lVar4;
          if (tVar2 < lVar4) {
            lVar3 = tVar2;
          }
          bVar5 = lVar4 == 0;
          lVar4 = lVar3;
          if (bVar5) {
            lVar4 = tVar2;
          }
        }
      }
      lVar3 = 1;
      bVar5 = (bool)((conn->shutdown).timeout_ms != 0 & bVar1);
      bVar1 = 0;
    } while (bVar5);
  }
  return lVar4;
}

Assistant:

timediff_t Curl_conn_shutdown_timeleft(struct connectdata *conn,
                                       struct curltime *nowp)
{
  timediff_t left_ms = 0, ms;
  struct curltime now;
  int i;

  for(i = 0; conn->shutdown.timeout_ms && (i < 2); ++i) {
    if(!conn->shutdown.start[i].tv_sec)
      continue;
    if(!nowp) {
      now = Curl_now();
      nowp = &now;
    }
    ms = Curl_shutdown_timeleft(conn, i, nowp);
    if(ms && (!left_ms || ms < left_ms))
      left_ms = ms;
  }
  return left_ms;
}